

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaRex.c
# Opt level: O3

Gia_Man_t * Gia_ManRex2Gia(char *pStrInit,int fOrder,int fVerbose)

{
  Gia_Obj_t *pGVar1;
  char cVar2;
  byte bVar3;
  int iVar4;
  undefined4 uVar5;
  Gia_Obj_t *pGVar6;
  ulong uVar7;
  Vec_Int_t *pVVar8;
  uint nRegs;
  int iVar9;
  uint uVar10;
  char *pStr;
  size_t sVar11;
  Gia_Man_t *pGVar12;
  size_t sVar13;
  char *pcVar14;
  Gia_Obj_t *pGVar15;
  uint *__ptr;
  undefined4 *__s;
  Vec_Int_t *vStaTrans;
  Vec_Int_t *p;
  int *piVar16;
  Vec_Int_t *vVisited;
  Gia_Man_t *p_00;
  ulong uVar17;
  int iVar18;
  ulong uVar19;
  uint uVar20;
  uint uVar21;
  ulong uVar23;
  uint uVar24;
  long lVar25;
  uint uVar26;
  long lVar27;
  ulong uVar28;
  Vec_Int_t *vStr2Sta;
  Vec_Int_t *vAlphas;
  int *local_c8;
  int *local_c0;
  Vec_Int_t *local_70;
  uint local_64;
  size_t local_60;
  ulong local_58;
  Gia_Obj_t *local_50;
  ulong local_48;
  size_t local_40;
  Vec_Int_t *local_38;
  int iVar22;
  
  pStr = Gia_ManRexPreprocess(pStrInit);
  nRegs = Gia_ManRexNumInputs(pStr,&local_38,&local_70);
  sVar11 = strlen(pStr);
  if (fOrder != 0) {
    qsort(local_38->pArray,(long)local_38->nSize,4,Vec_IntSortCompare1);
  }
  printf("Input variable order: ");
  if (0 < local_38->nSize) {
    lVar25 = 0;
    do {
      putchar((int)(char)local_38->pArray[lVar25]);
      lVar25 = lVar25 + 1;
    } while (lVar25 < local_38->nSize);
  }
  putchar(10);
  pGVar12 = Gia_ManStart(1000);
  if (pStrInit == (char *)0x0) {
    pcVar14 = (char *)0x0;
  }
  else {
    sVar13 = strlen(pStrInit);
    pcVar14 = (char *)malloc(sVar13 + 1);
    strcpy(pcVar14,pStrInit);
  }
  pGVar12->pName = pcVar14;
  iVar9 = local_38->nSize + nRegs;
  if (iVar9 != 0 && SCARRY4(local_38->nSize,nRegs) == iVar9 < 0) {
    iVar9 = 0;
    do {
      pGVar15 = Gia_ManAppendObj(pGVar12);
      uVar19 = *(ulong *)pGVar15;
      *(ulong *)pGVar15 = uVar19 | 0x9fffffff;
      *(ulong *)pGVar15 =
           uVar19 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(pGVar12->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar6 = pGVar12->pObjs;
      if ((pGVar15 < pGVar6) || (pGVar6 + pGVar12->nObjs <= pGVar15)) goto LAB_007a5db8;
      Vec_IntPush(pGVar12->vCis,(int)((ulong)((long)pGVar15 - (long)pGVar6) >> 2) * -0x55555555);
      if ((pGVar15 < pGVar12->pObjs) || (pGVar12->pObjs + pGVar12->nObjs <= pGVar15))
      goto LAB_007a5db8;
      iVar9 = iVar9 + 1;
    } while (iVar9 < (int)(local_38->nSize + nRegs));
  }
  uVar20 = nRegs + 1;
  __ptr = (uint *)malloc(0x10);
  local_58 = 0x10;
  if (0xe < nRegs) {
    local_58 = (ulong)uVar20;
  }
  uVar10 = (uint)local_58;
  *__ptr = uVar10;
  local_40 = (size_t)(int)uVar10;
  local_60 = (size_t)(int)uVar20;
  uVar24 = (uint)sVar11;
  local_64 = uVar20;
  if (uVar10 == 0) {
    __ptr[2] = 0;
    __ptr[3] = 0;
    __ptr[1] = uVar20;
    __s = (undefined4 *)0x0;
  }
  else {
    __s = (undefined4 *)malloc(local_40 * 4);
    *(undefined4 **)(__ptr + 2) = __s;
    __ptr[1] = uVar20;
    if (__s == (undefined4 *)0x0) {
      __s = (undefined4 *)0x0;
    }
    else {
      memset(__s,0,local_60 * 4);
    }
  }
  vStaTrans = (Vec_Int_t *)malloc(0x10);
  uVar20 = 0x10;
  if (0xe < uVar24 - 1) {
    uVar20 = uVar24;
  }
  vStaTrans->nCap = uVar20;
  if (uVar20 == 0) {
    vStaTrans->pArray = (int *)0x0;
    vStaTrans->nSize = uVar24;
    p = (Vec_Int_t *)malloc(0x10);
    local_c8 = (int *)0x0;
    p->nCap = 0;
    p->nSize = 0;
    piVar16 = (int *)0x0;
  }
  else {
    local_c8 = (int *)malloc((long)(int)uVar20 << 2);
    vStaTrans->pArray = local_c8;
    vStaTrans->nSize = uVar24;
    if (local_c8 != (int *)0x0) {
      memset(local_c8,0xff,(long)(int)uVar24 << 2);
    }
    p = (Vec_Int_t *)malloc(0x10);
    p->nSize = 0;
    p->nCap = uVar20;
    piVar16 = (int *)malloc((long)(int)uVar20 << 2);
  }
  local_c0 = &p->nSize;
  p->pArray = piVar16;
  iVar18 = uVar24 + 1;
  vVisited = (Vec_Int_t *)malloc(0x10);
  iVar9 = 0x10;
  if (0xe < uVar24) {
    iVar9 = iVar18;
  }
  vVisited->nCap = iVar9;
  if (iVar9 == 0) {
    vVisited->pArray = (int *)0x0;
    vVisited->nSize = iVar18;
  }
  else {
    piVar16 = (int *)malloc((long)iVar9 << 2);
    vVisited->pArray = piVar16;
    vVisited->nSize = iVar18;
    if (piVar16 != (int *)0x0) {
      memset(piVar16,0xff,(long)iVar18 << 2);
    }
  }
  if (0 < (int)uVar24) {
    uVar19 = 0;
    do {
      cVar2 = pStr[uVar19];
      uVar10 = (uint)uVar19;
      uVar20 = uVar10;
      if (cVar2 == '(') {
LAB_007a54d2:
        Vec_IntPush(p,uVar10);
      }
      else if (cVar2 == ')') {
        iVar9 = *local_c0;
        if (iVar9 < 1) goto LAB_007a5eb0;
        uVar21 = iVar9 - 1;
        *local_c0 = uVar21;
        uVar20 = p->pArray[uVar21];
        if (pStr[(int)uVar20] == '|') {
          if (uVar21 == 0) goto LAB_007a5eb0;
          *local_c0 = iVar9 - 2U;
          uVar21 = p->pArray[iVar9 - 2U];
          if (((((long)(int)uVar21 < 0) || ((int)uVar24 <= (int)uVar21)) ||
              (local_c8[(int)uVar21] = uVar20 + 1, (int)uVar20 < 0)) || (uVar24 <= uVar20))
          goto LAB_007a5e72;
          local_c8[(int)uVar20] = uVar10;
          uVar20 = uVar21;
        }
      }
      else if (cVar2 == '|') goto LAB_007a54d2;
      uVar23 = uVar19 + 1;
      if ((uVar19 < uVar24 - 1) && (pStr[uVar19 + 1] == '*')) {
        if (((int)uVar20 < 0) ||
           (((int)uVar24 <= (int)uVar20 ||
            (local_c8[uVar20] = uVar10 + 1, (uVar24 & 0x7fffffff) <= uVar23)))) {
LAB_007a5e72:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        local_c8[uVar19 + 1] = uVar20;
      }
      uVar19 = uVar23;
    } while ((uVar24 & 0x7fffffff) != uVar23);
    if (*local_c0 != 0) {
      __assert_fail("Vec_IntSize(vStack) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaRex.c"
                    ,0xfe,"Gia_Man_t *Gia_ManRex2Gia(char *, int, int)");
    }
  }
  if (fVerbose != 0) {
    Gia_ManPrintAutom(pStr,vStaTrans);
  }
  Gia_ManHashAlloc(pGVar12);
  pVVar8 = local_70;
  local_c8._0_4_ = 1;
  if (1 < (int)uVar24) {
    local_c8._0_4_ = 1;
    uVar19 = 1;
    do {
      bVar3 = pStr[uVar19];
      if ((2 < bVar3 - 0x28) && (bVar3 != 0x7c)) {
        Gia_ManCollectReached(pStr,vStaTrans,(int)uVar19,p,vVisited,(int)local_c8);
        if (fVerbose != 0) {
          Gia_ManPrintReached(pStr,(int)uVar19,p);
        }
        if ((long)pVVar8->nSize <= (long)uVar19) goto LAB_007a5d99;
        uVar20 = local_38->nSize;
        uVar10 = pVVar8->pArray[uVar19] + uVar20;
        iVar9 = pGVar12->vCis->nSize;
        iVar18 = iVar9 - pGVar12->nRegs;
        if (iVar18 <= (int)uVar10) goto LAB_007a5e53;
        if (((int)uVar10 < 0) || (iVar9 <= (int)uVar10)) goto LAB_007a5d99;
        piVar16 = pGVar12->vCis->pArray;
        iVar4 = piVar16[uVar10];
        if ((long)iVar4 < 0) goto LAB_007a5df6;
        uVar10 = pGVar12->nObjs;
        if ((int)uVar10 <= iVar4) goto LAB_007a5df6;
        pGVar6 = pGVar12->pObjs;
        pGVar15 = (Gia_Obj_t *)((ulong)(pGVar6 + iVar4) & 0xfffffffffffffffe);
        if ((pGVar15 < pGVar6) || (pGVar1 = pGVar6 + uVar10, pGVar1 <= pGVar15)) goto LAB_007a5db8;
        iVar22 = (int)((ulong)((long)pGVar15 - (long)pGVar6) >> 2);
        uVar21 = iVar22 * -0x55555555;
        if ((int)uVar21 < 0) goto LAB_007a5e34;
        uVar26 = 0xffffffff;
        if (0 < (int)uVar20) {
          uVar23 = 0;
          do {
            local_50 = pGVar1;
            local_48 = (ulong)uVar21;
            if (local_38->pArray[uVar23] == (int)(char)bVar3) {
              uVar26 = (uint)uVar23;
              break;
            }
            uVar23 = uVar23 + 1;
            uVar26 = 0xffffffff;
          } while (uVar20 != uVar23);
        }
        if (iVar18 <= (int)uVar26) goto LAB_007a5e53;
        if (((int)uVar26 < 0) || (iVar9 <= (int)uVar26)) goto LAB_007a5d99;
        iVar9 = piVar16[uVar26];
        if (((long)iVar9 < 0) || ((int)uVar10 <= iVar9)) goto LAB_007a5df6;
        pGVar15 = (Gia_Obj_t *)((ulong)(pGVar6 + iVar9) & 0xfffffffffffffffe);
        if ((pGVar15 < pGVar6) || (pGVar1 <= pGVar15)) goto LAB_007a5db8;
        iVar18 = (int)((ulong)((long)pGVar15 - (long)pGVar6) >> 2);
        if (iVar18 * -0x55555555 < 0) goto LAB_007a5e34;
        local_c8._0_4_ = (int)local_c8 + 1;
        iVar9 = Gia_ManHashAnd(pGVar12,((uint)(pGVar6 + iVar4) & 1) + iVar22 * 0x55555556,
                               ((uint)(pGVar6 + iVar9) & 1) + iVar18 * 0x55555556);
        if (0 < *local_c0) {
          lVar25 = 0;
          do {
            iVar18 = p->pArray[lVar25];
            if (((long)iVar18 < 0) || (pVVar8->nSize <= iVar18)) goto LAB_007a5d99;
            lVar27 = (long)pVVar8->pArray[iVar18];
            if ((lVar27 < 0) || ((int)__ptr[1] <= pVVar8->pArray[iVar18])) goto LAB_007a5d99;
            iVar9 = Gia_ManHashOr(pGVar12,iVar9,__s[lVar27]);
            __s[lVar27] = iVar9;
            lVar25 = lVar25 + 1;
          } while (lVar25 < *local_c0);
        }
      }
      uVar19 = uVar19 + 1;
    } while (uVar19 != (uVar24 & 0x7fffffff));
  }
  *local_c0 = 0;
  if (0 < local_38->nSize) {
    lVar25 = 0;
    do {
      lVar27 = (long)pGVar12->vCis->nSize;
      if (lVar27 - pGVar12->nRegs <= lVar25) {
LAB_007a5e53:
        __assert_fail("v < Gia_ManPiNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d4,"Gia_Obj_t *Gia_ManPi(Gia_Man_t *, int)");
      }
      if (lVar27 <= lVar25) goto LAB_007a5d99;
      iVar9 = pGVar12->vCis->pArray[lVar25];
      if (((long)iVar9 < 0) || (pGVar12->nObjs <= iVar9)) {
LAB_007a5df6:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar6 = pGVar12->pObjs;
      pGVar15 = (Gia_Obj_t *)((ulong)(pGVar6 + iVar9) & 0xfffffffffffffffe);
      if ((pGVar15 < pGVar6) || (pGVar6 + (uint)pGVar12->nObjs <= pGVar15)) goto LAB_007a5db8;
      iVar18 = (int)((ulong)((long)pGVar15 - (long)pGVar6) >> 2);
      if (iVar18 * -0x55555555 < 0) {
LAB_007a5e34:
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x12e,"int Abc_Var2Lit(int, int)");
      }
      Vec_IntPush(p,((uint)(pGVar6 + iVar9) & 1) + iVar18 * 0x55555556);
      lVar25 = lVar25 + 1;
    } while (lVar25 < local_38->nSize);
  }
  iVar9 = Gia_ManBuild1Hot(pGVar12,p);
  uVar20 = __ptr[1];
  if (0 < (long)(int)uVar20) {
    lVar25 = 0;
    do {
      iVar18 = Gia_ManHashAnd(pGVar12,iVar9,__s[lVar25]);
      __s[lVar25] = iVar18;
      lVar25 = lVar25 + 1;
    } while ((int)uVar20 != lVar25);
  }
  Gia_ManHashStop(pGVar12);
  Gia_ManCollectReached(pStr,vStaTrans,0,p,vVisited,(int)local_c8);
  if (fVerbose != 0) {
    Gia_ManPrintReached(pStr,0,p);
  }
  if ((int)local_58 == 0) {
    pcVar14 = (char *)0x0;
  }
  else {
    pcVar14 = (char *)malloc(local_40);
  }
  memset(pcVar14,0,local_60);
  if (0 < (int)nRegs) {
    memset(pcVar14,0x30,(ulong)nRegs);
  }
  iVar9 = *local_c0;
  if (0 < (long)iVar9) {
    piVar16 = p->pArray;
    lVar25 = 0;
    do {
      iVar18 = piVar16[lVar25];
      if (pStr[iVar18] != '\0') {
        if ((iVar18 < 0) || (local_70->nSize <= iVar18)) {
LAB_007a5d99:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar18 = local_70->pArray[iVar18];
        if (((long)iVar18 < 0) || ((int)nRegs <= iVar18)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                        ,0x186,"void Vec_StrWriteEntry(Vec_Str_t *, int, char)");
        }
        pcVar14[iVar18] = '1';
      }
      lVar25 = lVar25 + 1;
    } while (iVar9 != lVar25);
  }
  if (fVerbose != 0) {
    printf("Init state = %s\n",pcVar14);
  }
  if ((int)uVar20 < 1) {
LAB_007a5eb0:
    __assert_fail("p->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x3bc,"int Vec_IntPop(Vec_Int_t *)");
  }
  uVar19 = (ulong)(uVar20 - 1);
  uVar5 = __s[uVar19];
  if (uVar20 - 1 == (uint)local_58) {
    if (uVar20 < 0x11) {
      __s = (undefined4 *)realloc(__s,0x40);
      *(undefined4 **)(__ptr + 2) = __s;
      if (__s == (undefined4 *)0x0) {
LAB_007a5f0d:
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      uVar24 = 0x10;
    }
    else {
      uVar24 = (uint)local_58 * 2;
      __s = (undefined4 *)realloc(__s,(ulong)uVar24 * 4);
      *(undefined4 **)(__ptr + 2) = __s;
      if (__s == (undefined4 *)0x0) goto LAB_007a5f0d;
    }
    *__ptr = uVar24;
  }
  __ptr[1] = uVar20;
  if (uVar19 != 0) {
    memmove(__s + 1,__s,uVar19 * 4);
  }
  *__s = uVar5;
  if (uVar20 != local_64) {
    __assert_fail("Vec_IntSize(vStaLits) == nStates + 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaRex.c"
                  ,0x130,"Gia_Man_t *Gia_ManRex2Gia(char *, int, int)");
  }
  uVar19 = (ulong)local_64;
  uVar23 = 0;
  do {
    uVar20 = __s[uVar23];
    if ((int)uVar20 < 0) {
LAB_007a5dd7:
      __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x314,"int Gia_ManAppendCo(Gia_Man_t *, int)");
    }
    uVar24 = uVar20 >> 1;
    if (pGVar12->nObjs <= (int)uVar24) goto LAB_007a5dd7;
    if ((~*(uint *)(pGVar12->pObjs + uVar24) & 0x1fffffff) != 0 &&
        (int)*(uint *)(pGVar12->pObjs + uVar24) < 0) {
      __assert_fail("!Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0)))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x315,"int Gia_ManAppendCo(Gia_Man_t *, int)");
    }
    pGVar15 = Gia_ManAppendObj(pGVar12);
    uVar7 = *(ulong *)pGVar15;
    *(ulong *)pGVar15 = uVar7 | 0x80000000;
    pGVar6 = pGVar12->pObjs;
    if ((pGVar15 < pGVar6) || (pGVar6 + pGVar12->nObjs <= pGVar15)) {
LAB_007a5db8:
      __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
    }
    uVar17 = (ulong)(((uint)((int)pGVar15 - (int)pGVar6) >> 2) * -0x55555555 - uVar24 & 0x1fffffff);
    uVar28 = (ulong)((uVar20 & 1) << 0x1d);
    *(ulong *)pGVar15 = uVar28 | uVar7 & 0xffffffffc0000000 | 0x80000000 | uVar17;
    *(ulong *)pGVar15 =
         uVar28 | uVar7 & 0xe0000000c0000000 | 0x80000000 | uVar17 |
         (ulong)(pGVar12->vCos->nSize & 0x1fffffff) << 0x20;
    pGVar6 = pGVar12->pObjs;
    if ((pGVar15 < pGVar6) || (pGVar6 + pGVar12->nObjs <= pGVar15)) goto LAB_007a5db8;
    Vec_IntPush(pGVar12->vCos,(int)((ulong)((long)pGVar15 - (long)pGVar6) >> 2) * -0x55555555);
    if (pGVar12->pFanData != (int *)0x0) {
      Gia_ObjAddFanout(pGVar12,pGVar15 + -(ulong)((uint)*(undefined8 *)pGVar15 & 0x1fffffff),pGVar15
                      );
    }
    if ((pGVar15 < pGVar12->pObjs) || (pGVar12->pObjs + pGVar12->nObjs <= pGVar15))
    goto LAB_007a5db8;
    uVar23 = uVar23 + 1;
    if (uVar19 == uVar23) {
      Gia_ManSetRegNum(pGVar12,nRegs);
      p_00 = Gia_ManCleanup(pGVar12);
      Gia_ManStop(pGVar12);
      pGVar12 = Gia_ManDupZeroUndc(p_00,pcVar14,0,0,0);
      Gia_ManStop(p_00);
      if (pcVar14 != (char *)0x0) {
        free(pcVar14);
      }
      if (local_38->pArray != (int *)0x0) {
        free(local_38->pArray);
      }
      free(local_38);
      if (local_70->pArray != (int *)0x0) {
        free(local_70->pArray);
      }
      free(local_70);
      free(__s);
      free(__ptr);
      if (vStaTrans->pArray != (int *)0x0) {
        free(vStaTrans->pArray);
      }
      free(vStaTrans);
      if (p->pArray != (int *)0x0) {
        free(p->pArray);
      }
      free(p);
      if (vVisited->pArray != (int *)0x0) {
        free(vVisited->pArray);
      }
      free(vVisited);
      if (pStr != (char *)0x0) {
        free(pStr);
      }
      return pGVar12;
    }
  } while( true );
}

Assistant:

Gia_Man_t * Gia_ManRex2Gia( char * pStrInit, int fOrder, int fVerbose )
{
    Gia_Man_t * pNew = NULL, * pTemp; 
    Vec_Int_t * vAlphas, * vStr2Sta, * vStaLits;
    Vec_Int_t * vStaTrans, * vStack, * vVisited;
    Vec_Str_t * vInit;
    char * pStr = Gia_ManRexPreprocess( pStrInit );
    int nStates = Gia_ManRexNumInputs( pStr, &vAlphas, &vStr2Sta );
    int i, k, iLit, Entry, nLength = strlen(pStr), nTravId = 1;
    if ( fOrder )
        Vec_IntSort( vAlphas, 0 );
//    if ( fVerbose )
    {
        printf( "Input variable order: " );
        Vec_IntForEachEntry( vAlphas, Entry, k )
            printf( "%c", (char)Entry );
        printf( "\n" );
    }
    // start AIG
    pNew = Gia_ManStart( 1000 );
    pNew->pName = Abc_UtilStrsav( pStrInit );
    for ( i = 0; i < Vec_IntSize(vAlphas) + nStates; i++ )
        Gia_ManAppendCi( pNew );
    // prepare automaton
    vStaLits  = Vec_IntStart( nStates + 1 );
    vStaTrans = Vec_IntStartFull( nLength );
    vStack    = Vec_IntAlloc( nLength );
    vVisited  = Vec_IntStartFull( nLength + 1 );
    for ( i = 0; i < nLength; i++ )
    {
        int Lp = i;
        if ( pStr[i] == '(' || pStr[i] == '|' )
            Vec_IntPush( vStack, i );
        else if ( pStr[i] == ')' )
        {
            int Or = Vec_IntPop( vStack );
            if ( pStr[Or] == '|' )
            {
                Lp = Vec_IntPop( vStack );
                Vec_IntWriteEntry( vStaTrans, Lp, Or + 1 );
                Vec_IntWriteEntry( vStaTrans, Or, i );
            }
            else
                Lp = Or;
        }
        if ( i < nLength - 1 && pStr[i+1] == '*' )
        {
            Vec_IntWriteEntry( vStaTrans, Lp, i+1 );
            Vec_IntWriteEntry( vStaTrans, i+1, Lp );
        }
    }
    assert( Vec_IntSize(vStack) == 0 );
    if ( fVerbose )
        Gia_ManPrintAutom( pStr, vStaTrans );

    // create next-state functions for each state
    Gia_ManHashAlloc( pNew );
    for ( i = 1; i < nLength; i++ )
    {
        int iThis, iThat, iThisLit, iInputLit;
        if ( Gia_SymbSpecial(pStr[i]) )
            continue;
        Gia_ManCollectReached( pStr, vStaTrans, i, vStack, vVisited, nTravId++ );
        if ( fVerbose )
            Gia_ManPrintReached( pStr, i, vStack );
        // create transitions from this state under this input
        iThis = Vec_IntEntry(vStr2Sta, i);
        iThisLit = Gia_Obj2Lit(pNew, Gia_ManPi(pNew, Vec_IntSize(vAlphas) + iThis));
        iInputLit = Gia_Obj2Lit(pNew, Gia_ManPi(pNew, Vec_IntFind(vAlphas, pStr[i])));
        iLit = Gia_ManHashAnd( pNew, iThisLit, iInputLit );
        Vec_IntForEachEntry( vStack, Entry, k )
        {
            iThat = Vec_IntEntry(vStr2Sta, Entry);
            iLit = Gia_ManHashOr( pNew, iLit, Vec_IntEntry(vStaLits, iThat) );
            Vec_IntWriteEntry( vStaLits, iThat, iLit );
        }
    }
    // create one-hotness
    Vec_IntClear( vStack );
    for ( i = 0; i < Vec_IntSize(vAlphas); i++ )
        Vec_IntPush( vStack, Gia_Obj2Lit(pNew, Gia_ManPi(pNew, i)) );
    iLit = Gia_ManBuild1Hot( pNew, vStack );
    // combine with outputs
    Vec_IntForEachEntry( vStaLits, Entry, k )
        Vec_IntWriteEntry( vStaLits, k, Gia_ManHashAnd(pNew, iLit, Entry) );
    Gia_ManHashStop( pNew );

    // collect initial state
    Gia_ManCollectReached( pStr, vStaTrans, 0, vStack, vVisited, nTravId++ );
    if ( fVerbose )
        Gia_ManPrintReached( pStr, 0, vStack );
    vInit = Vec_StrStart( nStates + 1 );
    Vec_StrFill( vInit, nStates, '0' );
    Vec_IntForEachEntry( vStack, Entry, k )
        if ( pStr[Entry] != '\0' )
            Vec_StrWriteEntry( vInit, Vec_IntEntry(vStr2Sta, Entry), '1' );
    if ( fVerbose )
        printf( "Init state = %s\n", Vec_StrArray(vInit) );

    // add outputs
    Vec_IntPushFirst( vStaLits, Vec_IntPop(vStaLits) );
    assert( Vec_IntSize(vStaLits) == nStates + 1 );
    Vec_IntForEachEntry( vStaLits, iLit, i )
        Gia_ManAppendCo( pNew, iLit );
    Gia_ManSetRegNum( pNew, nStates );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );

    // add initial state
    pNew = Gia_ManDupZeroUndc( pTemp = pNew, Vec_StrArray(vInit), 0, 0, 0 );
    Gia_ManStop( pTemp );
    Vec_StrFree( vInit );
/*
    Gia_ManAutomSimulate( pNew, vAlphas, "0" );
    Gia_ManAutomSimulate( pNew, vAlphas, "01" );
    Gia_ManAutomSimulate( pNew, vAlphas, "110" );
    Gia_ManAutomSimulate( pNew, vAlphas, "011" );
    Gia_ManAutomSimulate( pNew, vAlphas, "111" );
    Gia_ManAutomSimulate( pNew, vAlphas, "1111" );
    Gia_ManAutomSimulate( pNew, vAlphas, "1010" );

    Gia_ManAutomSimulate( pNew, vAlphas, "A" );
    Gia_ManAutomSimulate( pNew, vAlphas, "AD" );
    Gia_ManAutomSimulate( pNew, vAlphas, "ABCD" );
    Gia_ManAutomSimulate( pNew, vAlphas, "BCD" );
    Gia_ManAutomSimulate( pNew, vAlphas, "CD" );
*/

    // cleanup
    Vec_IntFree( vAlphas );
    Vec_IntFree( vStr2Sta );
    Vec_IntFree( vStaLits );
    Vec_IntFree( vStaTrans );
    Vec_IntFree( vStack );
    Vec_IntFree( vVisited );
    ABC_FREE( pStr );
    return pNew;
}